

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O3

void visit_module_decl(gvisitor_t *self,gnode_module_decl_t *node)

{
  size_t sVar1;
  void *pvVar2;
  long *plVar3;
  gnode_n env;
  long lVar4;
  long lVar5;
  gnode_t *pgVar6;
  ulong uVar7;
  
  plVar3 = *self->data;
  env = NODE_LIST_STAT;
  if ((plVar3 == (long *)0x0) || (*plVar3 == 0)) {
    pgVar6 = (gnode_t *)0x0;
  }
  else {
    pgVar6 = *(gnode_t **)(plVar3[2] + -8 + *plVar3 * 8);
  }
  node->env = pgVar6;
  if (pgVar6->tag != NODE_LIST_STAT) {
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,"Module %s cannot be declared here.",
                 node->identifier);
    env = pgVar6->tag;
  }
  check_access_storage_specifiers(self,&node->base,env,node->access,node->storage);
  plVar3 = *self->data;
  lVar4 = *plVar3;
  if (lVar4 == plVar3[1]) {
    lVar5 = 8;
    if (lVar4 != 0) {
      lVar5 = lVar4 * 2;
    }
    plVar3[1] = lVar5;
    pvVar2 = realloc((void *)plVar3[2],lVar5 << 3);
    plVar3 = *self->data;
    plVar3[2] = (long)pvVar2;
    lVar4 = *plVar3;
  }
  else {
    pvVar2 = (void *)plVar3[2];
  }
  *plVar3 = lVar4 + 1;
  *(gnode_module_decl_t **)((long)pvVar2 + lVar4 * 8) = node;
  if ((node->decls != (gnode_r *)0x0) && (sVar1 = node->decls->n, sVar1 != 0)) {
    uVar7 = 0;
    do {
      if (uVar7 < node->decls->n) {
        pgVar6 = node->decls->p[uVar7];
      }
      else {
        pgVar6 = (gnode_t *)0x0;
      }
      gvisit(self,pgVar6);
      uVar7 = uVar7 + 1;
    } while (sVar1 != uVar7);
  }
  lVar4 = **self->data;
  if (lVar4 != 0) {
    **self->data = lVar4 + -1;
  }
  return;
}

Assistant:

static void visit_module_decl (gvisitor_t *self, gnode_module_decl_t *node) {
    #pragma unused(self, node)
    DEBUG_CODEGEN("visit_module_decl %s", node->identifier);

    // a module should be like a class with static entries
    // instantiated with import

//    gravity_module_t *module = gravity_module_new(GET_VM(), node->identifier);
//    CONTEXT_PUSH(module);
//
//    // process inner declarations
//    gnode_array_each(node->decls, {visit(val);});
//
//    // adjust declaration stack
//    CONTEXT_POP();
}